

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O1

double __thiscall
free_format_parser::HMpsFF::getValue(HMpsFF *this,string *word,bool *is_nan,HighsInt id)

{
  pointer pcVar1;
  char *pcVar2;
  ulong uVar3;
  undefined4 in_register_0000000c;
  double dVar4;
  string local_word;
  char *local_38 [2];
  char local_28 [16];
  
  pcVar1 = (word->_M_dataplus)._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + word->_M_string_length,
             CONCAT44(in_register_0000000c,id));
  uVar3 = std::__cxx11::string::find((char *)local_38,0x3c73fa,0);
  if (uVar3 == 0xffffffffffffffff) {
    uVar3 = std::__cxx11::string::find((char *)local_38,0x3e1ff1,0);
    if (uVar3 == 0xffffffffffffffff) goto LAB_001fd630;
  }
  std::__cxx11::string::replace((ulong)local_38,uVar3,&DAT_00000001,0x3dea9e);
LAB_001fd630:
  pcVar2 = local_38[0];
  dVar4 = atof(local_38[0]);
  *is_nan = false;
  if (pcVar2 != local_28) {
    operator_delete(pcVar2);
  }
  return dVar4;
}

Assistant:

double HMpsFF::getValue(const std::string& word, bool& is_nan,
                        const HighsInt id) const {
  // Lambda to replace any d or D by E
  auto dD2e = [&](std::string& word) {
    size_t ix = word.find("D");
    if (ix != std::string::npos) {
      word.replace(ix, 1, "E");
    } else {
      ix = word.find("d");
      if (ix != std::string::npos) word.replace(ix, 1, "E");
    }
  };

  std::string local_word = word;
  dD2e(local_word);
  const double value = atof(local_word.c_str());
  is_nan = false;
  //  printf("value(%d) = %g\n", int(id), value);
  //  if (std::isnan(value)) return true;
  //  // atof('nan') yields 0 with some Windows compilers, so try a string
  //  // comparison
  //  std::string lower_word = word;
  //  if (str_tolower(lower_word) == "nan") return true;
  return value;
}